

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void __thiscall FExecList::AddCommand(FExecList *this,char *cmd,char *file)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  char *file_00;
  int i;
  FCommandLine argv;
  FCommandLine local_48;
  
  local_48.cmd = cmd;
  if (file == (char *)0x0) {
LAB_0035bab2:
    iVar2 = strncasecmp(cmd,"exec",4);
    if (iVar2 == 0) {
      iVar2 = isspace((int)cmd[4]);
      if (iVar2 != 0) {
        local_48._argc = -1;
        local_48._argv = (char **)0x0;
        local_48.noescapes = false;
        iVar2 = 1;
        while( true ) {
          iVar3 = FCommandLine::argc(&local_48);
          if (iVar3 <= iVar2) break;
          file_00 = FCommandLine::operator[](&local_48,iVar2);
          C_ParseExecFile(file_00,this);
          iVar2 = iVar2 + 1;
        }
        goto LAB_0035bb8d;
      }
    }
    FString::FString((FString *)&local_48,cmd);
    TArray<FString,_FString>::Grow(&this->Commands,1);
    FString::AttachToOther((this->Commands).Array + (this->Commands).Count,(FString *)&local_48);
    puVar1 = &(this->Commands).Count;
    *puVar1 = *puVar1 + 1;
    FString::~FString((FString *)&local_48);
  }
  else {
    iVar2 = strncasecmp(cmd,"pullin",6);
    if (iVar2 != 0) goto LAB_0035bab2;
    iVar2 = isspace((int)cmd[6]);
    if (iVar2 == 0) goto LAB_0035bab2;
    local_48._argc = -1;
    local_48._argv = (char **)0x0;
    local_48.noescapes = false;
    C_SearchForPullins(this,file,&local_48);
LAB_0035bb8d:
    if (local_48._argv != (char **)0x0) {
      operator_delete__(local_48._argv);
    }
  }
  return;
}

Assistant:

void FExecList::AddCommand(const char *cmd, const char *file)
{
	// Pullins are special and need to be separated from general commands.
	// They also turned out to be a really bad idea, since they make things
	// more complicated. :(
	if (file != NULL && strnicmp(cmd, "pullin", 6) == 0 && isspace(cmd[6]))
	{
		FCommandLine line(cmd);
		C_SearchForPullins(this, file, line);
	}
	// Recursive exec: Parse this file now.
	else if (strnicmp(cmd, "exec", 4) == 0 && isspace(cmd[4]))
	{
		FCommandLine argv(cmd);
		for (int i = 1; i < argv.argc(); ++i)
		{
			C_ParseExecFile(argv[i], this);
		}
	}
	else
	{
		Commands.Push(cmd);
	}
}